

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

void __thiscall
jsoncons::jmespath::detail::
token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
construct(token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *this,token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *other)

{
  half_storage *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffd8;
  
  (in_RDI->field_0).half_float_ = *in_RSI;
  switch((in_RDI->field_0).half_float_) {
  case (half_storage)0xb:
  case (half_storage)0x17:
    std::__cxx11::string::operator=
              ((string *)&(in_RDI->field_0).json_const_pointer_.ref_,(string *)(in_RSI + 2));
    break;
  case (half_storage)0xc:
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              (in_RDI,in_stack_ffffffffffffffd8);
    break;
  case (half_storage)0xd:
    in_RDI[2].field_0.int64_.val_ = *(int64_t *)(in_RSI + 10);
    break;
  case (half_storage)0xe:
    in_RDI[2].field_0.int64_.val_ = *(int64_t *)(in_RSI + 10);
    break;
  case (half_storage)0xf:
    in_RDI[2].field_0.int64_.val_ = *(int64_t *)(in_RSI + 10);
    break;
  case (half_storage)0x10:
    in_RDI[2].field_0.int64_.val_ = *(int64_t *)(in_RSI + 10);
    break;
  default:
    break;
  case (half_storage)0x16:
    std::__cxx11::string::operator=
              ((string *)&(in_RDI->field_0).json_const_pointer_.ref_,(string *)(in_RSI + 2));
    in_RDI[2].field_0.int64_.val_ = *(int64_t *)(in_RSI + 10);
  }
  return;
}

Assistant:

void construct(token<Json>&& other)
        {
            type_ = other.type_;
            switch (type_)
            {
                case token_kind::variable:
                    key_ = std::move(other.key_);
                    expression_ = other.expression_;
                    break;
                case token_kind::variable_binding:
                case token_kind::key:
                    key_ = std::move(other.key_);
                    break;
                case token_kind::literal:
                    new (&value_) Json(std::move(other.value_));
                    break;
                case token_kind::expression:
                    expression_ = other.expression_;
                    break;
                case token_kind::unary_operator:
                    unary_operator_ = other.unary_operator_;
                    break;
                case token_kind::binary_operator:
                    binary_operator_ = other.binary_operator_;
                    break;
                case token_kind::function:
                    function_ = other.function_;
                    break;
                default:
                    break;
            }
        }